

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_handle.cpp
# Opt level: O3

unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> __thiscall
duckdb::CSVFileHandle::OpenFileHandle
          (CSVFileHandle *this,FileSystem *fs,Allocator *allocator,OpenFileInfo *file,
          FileCompressionType compression)

{
  bool bVar1;
  pointer pFVar2;
  pointer *__ptr;
  undefined7 in_register_00000081;
  optional_ptr<duckdb::FileOpener,_true> opener;
  FileOpenFlags flags;
  
  opener.ptr._0_4_ = (int)CONCAT71(in_register_00000081,compression) << 8;
  opener.ptr._4_4_ = 0;
  flags.lock = READ_LOCK;
  flags.compression = AUTO_DETECT;
  flags._10_6_ = 0;
  flags.flags = (idx_t)file;
  FileSystem::OpenFile((FileSystem *)this,(OpenFileInfo *)fs,flags,opener);
  pFVar2 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                       *)this);
  bVar1 = FileHandle::CanSeek(pFVar2);
  if (bVar1) {
    pFVar2 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                         *)this);
    FileHandle::Reset(pFVar2);
  }
  return (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)
         (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)this;
}

Assistant:

unique_ptr<FileHandle> CSVFileHandle::OpenFileHandle(FileSystem &fs, Allocator &allocator, const OpenFileInfo &file,
                                                     FileCompressionType compression) {
	auto file_handle = fs.OpenFile(file, FileFlags::FILE_FLAGS_READ | compression);
	if (file_handle->CanSeek()) {
		file_handle->Reset();
	}
	return file_handle;
}